

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::CLUFactor<double>::factor
          (CLUFactor<double> *this,SVectorBase<double> **vec,double threshold,double eps)

{
  Status SVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  int iVar6;
  long lVar7;
  
  (*this->factorTime->_vptr_Timer[3])();
  this->stat = OK;
  *(this->l).start = 0;
  (this->l).firstUpdate = 0;
  (this->l).firstUnused = 0;
  Temp::init(&this->temp,(EVP_PKEY_CTX *)(ulong)(uint)this->thedim);
  if (0 < this->thedim) {
    piVar2 = (this->col).perm;
    piVar3 = (this->col).orig;
    piVar4 = (this->row).orig;
    piVar5 = (this->row).perm;
    lVar7 = 0;
    do {
      piVar2[lVar7] = -1;
      piVar3[lVar7] = -1;
      piVar5[lVar7] = -1;
      piVar4[lVar7] = -1;
      lVar7 = lVar7 + 1;
    } while (lVar7 < this->thedim);
  }
  initFactorMatrix(this,vec,eps);
  if (((this->stat == OK) && (colSingletons(this), this->stat == OK)) &&
     (rowSingletons(this), this->stat == OK)) {
    if ((this->temp).stage < this->thedim) {
      initFactorRings(this);
      eliminateNucleus(this,eps,threshold);
      freeFactorRings(this);
      SVar1 = this->stat;
      (this->l).firstUpdate = (this->l).firstUnused;
      if (SVar1 != OK) goto LAB_001db745;
    }
    else {
      (this->l).firstUpdate = (this->l).firstUnused;
    }
    setupRowVals(this);
    iVar6 = setupColVals(this);
    this->nzCnt = iVar6;
  }
  else {
    (this->l).firstUpdate = (this->l).firstUnused;
  }
LAB_001db745:
  (*this->factorTime->_vptr_Timer[4])();
  this->factorCount = this->factorCount + 1;
  return;
}

Assistant:

void CLUFactor<R>::factor(const SVectorBase<R>**
                          vec,          ///< Array of column VectorBase<R> pointers
                          R            threshold,    ///< pivoting threshold
                          R            eps)          ///< epsilon for zero detection
{

   factorTime->start();

   this->stat = SLinSolver<R>::OK;

   l.start[0]    = 0;
   l.firstUpdate = 0;
   l.firstUnused = 0;

   temp.init(thedim);
   initPerm();

   initFactorMatrix(vec, eps);

   if(this->stat)
      goto TERMINATE;

   //   initMaxabs = initMaxabs;

   colSingletons();

   if(this->stat != SLinSolver<R>::OK)
      goto TERMINATE;

   rowSingletons();

   if(this->stat != SLinSolver<R>::OK)
      goto TERMINATE;

   if(temp.stage < thedim)
   {
      initFactorRings();
      eliminateNucleus(eps, threshold);
      freeFactorRings();
   }

TERMINATE:

   l.firstUpdate = l.firstUnused;

   if(this->stat == SLinSolver<R>::OK)
   {
#ifdef SOPLEX_WITH_L_ROWS
      setupRowVals();
#endif
      nzCnt = setupColVals();
   }

   factorTime->stop();

   factorCount++;
}